

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

void LLVMConsumeError(LLVMErrorRef Err)

{
  Error local_20;
  anon_class_1_0_00000001 local_11;
  
  local_20.Payload = (ErrorInfoBase *)((ulong)Err | 1);
  llvm::handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
            (&local_20,&local_11);
  if ((long *)((ulong)local_20.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_20.Payload & 0xfffffffffffffffe) + 8))();
  }
  return;
}

Assistant:

void LLVMConsumeError(LLVMErrorRef Err) { consumeError(unwrap(Err)); }